

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

int sha512_done(sha512_state *md,uchar *out)

{
  ulong uVar1;
  int iVar2;
  undefined8 in_RAX;
  long lVar3;
  ulong uVar4;
  
  iVar2 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),md == (sha512_state *)0x0);
  if (out != (uchar *)0x0 && md != (sha512_state *)0x0) {
    uVar4 = md->curlen;
    if (uVar4 < 0x80) {
      md->length = md->length + uVar4 * 8;
      md->curlen = uVar4 + 1;
      md->buf[uVar4] = 0x80;
      uVar4 = md->curlen;
      if (0x70 < uVar4) {
        if (uVar4 < 0x80) {
          do {
            uVar1 = uVar4 + 1;
            md->curlen = uVar1;
            md->buf[uVar4] = '\0';
            uVar4 = uVar1;
          } while (uVar1 != 0x80);
        }
        s_sha512_compress(md,md->buf);
        uVar4 = 0;
      }
      lVar3 = uVar4 - 0x78;
      do {
        md->curlen = lVar3 + 0x79;
        md->buf[lVar3 + 0x78] = '\0';
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0);
      uVar4 = md->length;
      *(ulong *)(md->buf + 0x78) =
           uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
           (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
           (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      s_sha512_compress(md,md->buf);
      uVar4 = 0;
      do {
        out[uVar4 * 8] = *(uchar *)((long)md->state + uVar4 * 8 + 7);
        out[uVar4 * 8 + 1] = *(uchar *)((long)md->state + uVar4 * 8 + 6);
        out[uVar4 * 8 + 2] = *(uchar *)((long)md->state + uVar4 * 8 + 5);
        out[uVar4 * 8 + 3] = *(uchar *)((long)md->state + uVar4 * 8 + 4);
        out[uVar4 * 8 + 4] = *(uchar *)((long)md->state + uVar4 * 8 + 3);
        out[uVar4 * 8 + 5] = *(uchar *)((long)md->state + uVar4 * 8 + 2);
        out[uVar4 * 8 + 6] = *(uchar *)((long)md->state + uVar4 * 8 + 1);
        out[uVar4 * 8 + 7] = (uchar)md->state[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar4 != 8);
    }
    iVar2 = (int)uVar4;
  }
  return iVar2;
}

Assistant:

static int sha512_done(struct sha512_state * md, unsigned char *out)
{
    int i;

    if (md == NULL) return -1;
    if (out == NULL) return -1;

    if (md->curlen >= sizeof(md->buf)) {
       return -1;
    }

    /* increase the length of the message */
    md->length += md->curlen * CONST64(8);

    /* append the '1' bit */
    md->buf[md->curlen++] = (unsigned char)0x80;

    /* if the length is currently above 112 bytes we append zeros
     * then compress.  Then we can fall back to padding zeros and length
     * encoding like normal.
     */
    if (md->curlen > 112) {
        while (md->curlen < 128) {
            md->buf[md->curlen++] = (unsigned char)0;
        }
        s_sha512_compress(md, md->buf);
        md->curlen = 0;
    }

    /* pad upto 120 bytes of zeroes
     * note: that from 112 to 120 is the 64 MSB of the length.  We assume that you won't hash
     * > 2^64 bits of data... :-)
     */
    while (md->curlen < 120) {
        md->buf[md->curlen++] = (unsigned char)0;
    }

    /* store length */
    STORE64H(md->length, md->buf+120);
    s_sha512_compress(md, md->buf);

    /* copy output */
    for (i = 0; i < 8; i++) {
        STORE64H(md->state[i], out+(8*i));
    }

    return 0;
}